

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_alloc.c
# Opt level: O0

light_option light_alloc_option(uint16_t option_length)

{
  light_option p_Var1;
  uint32_t *puVar2;
  ushort in_DI;
  uint16_t actual_size;
  _light_option *option;
  
  p_Var1 = (light_option)calloc(1,0x18);
  p_Var1->option_length = in_DI;
  if ((in_DI & 3) != 0) {
    in_DI = ((in_DI >> 2) + 1) * 4;
  }
  if (in_DI != 0) {
    puVar2 = (uint32_t *)calloc(1,(ulong)in_DI);
    p_Var1->data = puVar2;
  }
  return p_Var1;
}

Assistant:

light_option light_alloc_option(uint16_t option_length)
{
	struct _light_option *option = calloc(1, sizeof(struct _light_option));
	uint16_t actual_size = 0;

	option->option_length = option_length;

	PADD32(option_length, &actual_size);
	if (actual_size != 0) {
		option->data = calloc(1, actual_size);
	}

	return option;
}